

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O3

void __thiscall disp::h1(disp *this,string *s1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,':',s1);
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void h1(std::string s1)	
	{ v_ = ':'+s1; }